

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButtonPrivate::moveFocus(QAbstractButtonPrivate *this,int key)

{
  long *plVar1;
  QWidget *this_00;
  long lVar2;
  bool bVar3;
  Representation RVar4;
  FocusPolicy FVar5;
  QWidget *this_01;
  long lVar6;
  QPoint QVar7;
  QWidget *pQVar8;
  QWidget *pQVar9;
  QWidgetData *pQVar10;
  QPoint QVar11;
  long lVar12;
  FocusPolicy FVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  byte bVar18;
  undefined1 *puVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  Representation RVar25;
  int iVar26;
  long in_FS_OFFSET;
  bool bVar27;
  int local_a4;
  QWidget *local_a0;
  int local_98;
  int local_90;
  QPoint local_60;
  QList<QAbstractButton_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  queryButtonList(&local_58,this);
  if (this->group == (QButtonGroup *)0x0) {
    bVar18 = (byte)this->field_0x28c >> 3 & 1;
  }
  else {
    bVar18 = *(byte *)(*(long *)&this->group->field_0x8 + 0xa0);
  }
  this_01 = QApplication::focusWidget();
  lVar6 = QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
  if ((lVar6 != 0) && ((undefined1 *)local_58.d.size != (undefined1 *)0x0)) {
    lVar14 = 0;
    do {
      if (local_58.d.size << 3 == lVar14) goto LAB_003bdad5;
      lVar15 = lVar14 + 8;
      plVar1 = (long *)((long)local_58.d.ptr + lVar14);
      lVar14 = lVar15;
    } while (*plVar1 != lVar6);
    if (lVar15 != 0) {
      pQVar10 = this_01->data;
      iVar20 = (pQVar10->crect).x2.m_i;
      iVar24 = (pQVar10->crect).y2.m_i;
      iVar17 = (pQVar10->crect).x1.m_i;
      iVar22 = (pQVar10->crect).y1.m_i;
      local_60.xp.m_i = 0;
      local_60.yp.m_i = 0;
      QVar7 = QWidget::mapToGlobal(this_01,&local_60);
      bVar3 = qt_tab_all_widgets();
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        RVar25 = QVar7.xp.m_i;
        iVar20 = (iVar20 - iVar17) + RVar25.m_i;
        iVar24 = (iVar24 - iVar22) + QVar7.yp.m_i.m_i;
        lVar14 = ((long)iVar20 + (long)RVar25.m_i) / 2;
        lVar15 = ((long)iVar24 + ((long)QVar7 >> 0x20)) / 2;
        FVar13 = ~StrongFocus;
        if (bVar3) {
          FVar13 = ~TabFocus;
        }
        local_a4 = -1;
        puVar19 = (undefined1 *)0x0;
        local_a0 = (QWidget *)0x0;
        do {
          this_00 = &local_58.d.ptr[(long)puVar19]->super_QWidget;
          if (this_00 == this_01) goto switchD_003bda39_default;
          pQVar8 = QWidget::window(this_00);
          pQVar9 = QWidget::window(this_01);
          if ((pQVar8 != pQVar9) ||
             (pQVar10 = this_00->data, (pQVar10->widget_attributes & 0x10001) != 0))
          goto switchD_003bda39_default;
          if (bVar18 == 0) {
            FVar5 = QWidget::focusPolicy(this_00);
            if ((FVar5 | FVar13) != ~NoFocus) goto switchD_003bda39_default;
            pQVar10 = this_00->data;
          }
          iVar17 = (pQVar10->crect).x2.m_i;
          iVar22 = (pQVar10->crect).x1.m_i;
          iVar23 = (pQVar10->crect).y2.m_i;
          iVar21 = (pQVar10->crect).y1.m_i;
          local_60.xp.m_i = 0;
          local_60.yp.m_i = 0;
          QVar11 = QWidget::mapToGlobal(this_00,&local_60);
          RVar4 = QVar11.xp.m_i;
          iVar26 = (iVar17 - iVar22) + RVar4.m_i;
          iVar23 = (iVar23 - iVar21) + QVar11.yp.m_i.m_i;
          lVar16 = ((long)iVar26 + (long)RVar4.m_i) / 2;
          lVar12 = ((long)iVar23 + ((long)QVar11 >> 0x20)) / 2;
          iVar17 = (int)lVar12;
          iVar22 = (int)lVar16;
          local_98 = (int)lVar15;
          local_90 = (int)lVar14;
          if (((RVar4.m_i < iVar20) && (RVar25.m_i < iVar26)) &&
             ((key == 0x1000015 || (key == 0x1000013)))) {
            iVar17 = iVar17 - local_98;
            iVar21 = -iVar17;
            if (0 < iVar17) {
              iVar21 = iVar17;
            }
            iVar22 = iVar22 - local_90;
            iVar23 = -iVar22;
            if (0 < iVar22) {
              iVar23 = iVar22;
            }
            iVar23 = iVar23 + iVar21 * 0x10000;
          }
          else if (((QVar11.yp.m_i < iVar24) && (QVar7.yp.m_i < iVar23)) &&
                  ((key == 0x1000014 || (key == 0x1000012)))) {
            iVar22 = iVar22 - local_90;
            iVar21 = -iVar22;
            if (0 < iVar22) {
              iVar21 = iVar22;
            }
            iVar17 = iVar17 - local_98;
            iVar23 = -iVar17;
            if (0 < iVar17) {
              iVar23 = iVar17;
            }
            iVar23 = iVar23 + iVar21 * 0x10000;
          }
          else {
            iVar23 = (iVar17 - local_98) * (iVar17 - local_98) +
                     (iVar22 - local_90) * (iVar22 - local_90) + 0x40000000;
          }
          if ((local_a4 < iVar23) && (local_a0 != (QWidget *)0x0)) goto switchD_003bda39_default;
          switch(key) {
          case 0x1000012:
            bVar3 = SBORROW8(lVar16,lVar14);
            lVar12 = lVar16 - lVar14;
            break;
          case 0x1000013:
            bVar3 = SBORROW8(lVar12,lVar15);
            lVar12 = lVar12 - lVar15;
            break;
          case 0x1000014:
            bVar27 = SBORROW8(lVar16,lVar14);
            lVar2 = lVar16 - lVar14;
            bVar3 = lVar16 == lVar14;
            goto LAB_003bda4f;
          case 0x1000015:
            bVar27 = SBORROW8(lVar12,lVar15);
            lVar2 = lVar12 - lVar15;
            bVar3 = lVar12 == lVar15;
LAB_003bda4f:
            if (!bVar3 && bVar27 == lVar2 < 0) {
              local_a4 = iVar23;
              local_a0 = this_00;
            }
          default:
            goto switchD_003bda39_default;
          }
          if (bVar3 != lVar12 < 0) {
            local_a4 = iVar23;
            local_a0 = this_00;
          }
switchD_003bda39_default:
          puVar19 = puVar19 + 1;
        } while (puVar19 < (ulong)local_58.d.size);
        if ((bVar18 == 0) || (local_a0 == (QWidget *)0x0)) {
          if (local_a0 == (QWidget *)0x0) goto LAB_003bdad5;
        }
        else if (((*(byte *)(*(long *)(lVar6 + 8) + 0x28c) & 2) != 0) &&
                ((*(byte *)(*(long *)&local_a0->field_0x8 + 0x28c) & 1) != 0)) {
          QAbstractButton::click((QAbstractButton *)local_a0);
        }
        QWidget::setFocus(local_a0,((key & 0xfffffffeU) == 0x1000012) + TabFocusReason);
      }
    }
  }
LAB_003bdad5:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButtonPrivate::moveFocus(int key)
{
    QList<QAbstractButton *> buttonList = queryButtonList();
#if QT_CONFIG(buttongroup)
    bool exclusive = group ? group->d_func()->exclusive : autoExclusive;
#else
    bool exclusive = autoExclusive;
#endif
    QWidget *f = QApplication::focusWidget();
    QAbstractButton *fb = qobject_cast<QAbstractButton *>(f);
    if (!fb || !buttonList.contains(fb))
        return;

    QAbstractButton *candidate = nullptr;
    int bestScore = -1;
    QRect target = f->rect().translated(f->mapToGlobal(QPoint(0,0)));
    QPoint goal = target.center();
    uint focus_flag = qt_tab_all_widgets() ? Qt::TabFocus : Qt::StrongFocus;

    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *button = buttonList.at(i);
        if (button != f && button->window() == f->window() && button->isEnabled() && !button->isHidden() &&
            (exclusive || (button->focusPolicy() & focus_flag) == focus_flag)) {
            QRect buttonRect = button->rect().translated(button->mapToGlobal(QPoint(0,0)));
            QPoint p = buttonRect.center();

            //Priority to widgets that overlap on the same coordinate.
            //In that case, the distance in the direction will be used as significant score,
            //take also in account orthogonal distance in case two widget are in the same distance.
            int score;
            if ((buttonRect.x() < target.right() && target.x() < buttonRect.right())
                  && (key == Qt::Key_Up || key == Qt::Key_Down)) {
                //one item's is at the vertical of the other
                score = (qAbs(p.y() - goal.y()) << 16) + qAbs(p.x() - goal.x());
            } else if ((buttonRect.y() < target.bottom() && target.y() < buttonRect.bottom())
                        && (key == Qt::Key_Left || key == Qt::Key_Right) ) {
                //one item's is at the horizontal of the other
                score = (qAbs(p.x() - goal.x()) << 16) + qAbs(p.y() - goal.y());
            } else {
                score = (1 << 30) + (p.y() - goal.y()) * (p.y() - goal.y()) + (p.x() - goal.x()) * (p.x() - goal.x());
            }

            if (score > bestScore && candidate)
                continue;

            switch(key) {
            case Qt::Key_Up:
                if (p.y() < goal.y()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Down:
                if (p.y() > goal.y()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Left:
                if (p.x() < goal.x()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            case Qt::Key_Right:
                if (p.x() > goal.x()) {
                    candidate = button;
                    bestScore = score;
                }
                break;
            }
        }
    }

    if (exclusive
#ifdef QT_KEYPAD_NAVIGATION
        && !QApplicationPrivate::keypadNavigationEnabled()
#endif
        && candidate
        && fb->d_func()->checked
        && candidate->d_func()->checkable)
        candidate->click();

    if (candidate) {
        if (key == Qt::Key_Up || key == Qt::Key_Left)
            candidate->setFocus(Qt::BacktabFocusReason);
        else
            candidate->setFocus(Qt::TabFocusReason);
    }
}